

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintCallGraph.cpp
# Opt level: O0

Pass * wasm::createPrintCallGraphPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x58);
  memset(this,0,0x58);
  PrintCallGraph::PrintCallGraph((PrintCallGraph *)this);
  return this;
}

Assistant:

Pass* createPrintCallGraphPass() { return new PrintCallGraph(); }